

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arbitrary.h
# Opt level: O3

pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
* cppqc::detail::
  ArbitraryPair<std::pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>_>
  ::unGen(pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
          *__return_storage_ptr__,RngEngine *rng,size_t size)

{
  char *pcVar1;
  long lVar2;
  array<ArbitraryTestsFixtures::UserDefinedType,_2UL> local_70;
  vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
  local_30;
  
  ArbitraryImpl<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>_>::unGen
            (&local_70,rng,size);
  ArbitraryImpl<std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::unGen(&local_30,rng,size);
  std::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>_>
  ::
  pair<std::array<ArbitraryTestsFixtures::UserDefinedType,_2UL>,_std::vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>,_true>
            (__return_storage_ptr__,&local_70,&local_30);
  std::
  vector<ArbitraryTestsFixtures::UserDefinedType,_std::allocator<ArbitraryTestsFixtures::UserDefinedType>_>
  ::~vector(&local_30);
  lVar2 = 0;
  do {
    pcVar1 = *(char **)((long)&local_70._M_elems[1].check._M_dataplus._M_p + lVar2);
    if (local_70._M_elems[1].check.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return __return_storage_ptr__;
}

Assistant:

static PairType unGen(RngEngine& rng, std::size_t size) {
    return PairType(
        Arbitrary<typename PairType::first_type>::unGen(rng, size),
        Arbitrary<typename PairType::second_type>::unGen(rng, size));
  }